

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(int vi)

{
  ON_2dex in_RAX;
  int jValue;
  int iValue;
  ON_2dex local_8;
  
  switch(vi) {
  case 0:
    jValue = 1;
    iValue = jValue;
    break;
  case 1:
    jValue = 1;
    iValue = 2;
    break;
  case 2:
    jValue = 2;
    iValue = jValue;
    break;
  case 3:
    jValue = 2;
    iValue = 1;
    break;
  default:
    jValue = -0x7fffffff;
    iValue = -0x7fffffff;
  }
  local_8 = in_RAX;
  ON_2dex::ON_2dex(&local_8,iValue,jValue);
  return local_8;
}

Assistant:

const ON_2dex ON_SubDQuadNeighborhood::CenterVertexDex(
  int vi
)
{
  if (0 == vi)
    return ON_2dex(1, 1);
  if (1==vi)
    return ON_2dex(2, 1);
  if (2==vi)
    return ON_2dex(2, 2);
  if (3==vi)
    return ON_2dex(1, 2);
  return ON_2dex(ON_UNSET_INT_INDEX,ON_UNSET_INT_INDEX);
}